

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rectangular.cpp
# Opt level: O2

double __thiscall Rectangular::coordinateZ(Rectangular *this,int J,int K,int L,int G)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar3 = (double)J * (this->super_Parameterization).dx + (this->super_Parameterization).x_lb;
  (this->super_Parameterization).x = dVar3;
  dVar2 = (this->super_Parameterization).radius;
  dVar2 = dVar2 * dVar2 - dVar3 * dVar3;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  (this->super_Parameterization).y_lb = -dVar2;
  dVar2 = (this->super_Parameterization).radius;
  dVar3 = (this->super_Parameterization).x;
  dVar2 = dVar2 * dVar2 - dVar3 * dVar3;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  (this->super_Parameterization).y_ub = dVar2;
  dVar3 = (this->super_Parameterization).y_lb;
  dVar2 = (dVar2 - dVar3) / (double)((this->super_Parameterization).Kmax + -1);
  (this->super_Parameterization).dy = dVar2;
  dVar3 = (double)K * dVar2 + dVar3;
  (this->super_Parameterization).y = dVar3;
  dVar2 = (this->super_Parameterization).radius;
  dVar1 = (this->super_Parameterization).x;
  dVar2 = (dVar2 * dVar2 - dVar1 * dVar1) - dVar3 * dVar3;
  if (dVar2 <= 0.0) {
    dVar2 = 0.0;
  }
  dVar2 = SQRT(dVar2);
  dVar3 = -dVar2;
  (this->super_Parameterization).z_lb = dVar3;
  (this->super_Parameterization).z_ub = dVar2;
  if (G == 0) {
    (this->super_Parameterization).z = dVar3;
  }
  else if (G == 1) {
    (this->super_Parameterization).z = dVar2;
    dVar3 = dVar2;
  }
  else {
    dVar3 = (this->super_Parameterization).z;
  }
  return dVar3;
}

Assistant:

double Rectangular::coordinateZ(int J, int K, int L, int G) {
  x = x_lb + (double)J * dx;

  y_lb = -sqrt(radius * radius - x * x);
  y_ub =  sqrt(radius * radius - x * x);

  dy = (y_ub - y_lb) / (double)(Kmax - 1);

  y = y_lb + (double)K * dy;

  z_lb = -sqrt(max(0.0e0, radius * radius - x * x - y * y));
  z_ub = -z_lb;

  switch (G) {
    case 0:  // Lower z
      z = z_lb;
      break;
    case 1:  // Upper z
      z = z_ub;
      break;
  }

  return z;
}